

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

ArchType parseArch(StringRef ArchName)

{
  bool bVar1;
  ArchType AVar2;
  ISAKind IVar3;
  EndianKind EVar4;
  ArchType AVar5;
  ProfileKind PVar6;
  undefined *puVar7;
  ushort uVar8;
  uint uVar9;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ARM *this;
  bool bVar11;
  StringRef Arch;
  StringRef Arch_00;
  StringRef SVar12;
  ulong uVar10;
  
  SVar12.Data = (char *)ArchName.Length;
  this = (ARM *)ArchName.Data;
  if (SVar12.Data == &DAT_00000004) {
    bVar11 = *(int *)this == 0x36383369;
    bVar1 = bVar11;
    if ((!bVar11) && (bVar1 = true, *(int *)this != 0x36383469)) {
      bVar1 = bVar11;
    }
  }
  else {
    bVar1 = false;
  }
  if ((SVar12.Data == &DAT_00000004) && (!bVar1)) {
    bVar1 = true;
    if (*(int *)this != 0x36383569) {
      bVar1 = false;
    }
  }
  if ((SVar12.Data == &DAT_00000004) && (!bVar1)) {
    bVar1 = true;
    if (*(int *)this != 0x36383669) {
      bVar1 = false;
    }
  }
  if ((SVar12.Data == &DAT_00000004) && (!bVar1)) {
    bVar1 = true;
    if (*(int *)this != 0x36383769) {
      bVar1 = false;
    }
  }
  if ((SVar12.Data == &DAT_00000004) && (!bVar1)) {
    bVar1 = true;
    if (*(int *)this != 0x36383869) {
      bVar1 = false;
    }
  }
  if ((SVar12.Data == &DAT_00000004) && (!bVar1)) {
    bVar1 = true;
    if (*(int *)this != 0x36383969) {
      bVar1 = false;
    }
  }
  AVar2 = x86;
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x34 && *(int *)this == 0x36646d61;
    }
    else {
      bVar11 = false;
    }
    AVar2 = bVar11 + x86;
    bVar1 = true;
    if (bVar11 == false) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3436 && *(int *)this == 0x5f363878;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = x86_64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x6834365f && *(int *)this == 0x5f363878;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = x86_64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x63707265 && *(int *)this == 0x65776f70;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x63 && *(short *)this == 0x7070;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x32 && *(int *)this == 0x33637070;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000009) {
      bVar11 = this[8] == (ARM)0x34 && *(long *)this == 0x3663707265776f70;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x75 && *(short *)this == 0x7070;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x34 && *(int *)this == 0x36637070;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0xb) {
      bVar11 = *(long *)(this + 3) == 0x656c343663707265 && *(long *)this == 0x3663707265776f70;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc64le;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x656c3436 && *(int *)this == 0x36637070;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = ppc64le;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x656c && *(int *)this == 0x61637378;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = arm;
    }
    bVar1 = false;
    if (bVar11) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x8) {
      bVar11 = *(long *)this == 0x6265656c61637378;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = armeb;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34366863 && *(int *)this == 0x63726161;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = aarch64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0xa) {
      bVar11 = *(short *)(this + 8) == 0x6562 && *(long *)this == 0x5f34366863726161;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = aarch64_be;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x63 && *(short *)this == 0x7261;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = arc;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x34 && *(int *)this == 0x366d7261;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = aarch64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x6d && *(short *)this == 0x7261;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = arm;
    }
    bVar1 = false;
    if (bVar11) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x62 && *(int *)this == 0x656d7261;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = armeb;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x62 && *(int *)this == 0x6d756874;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = thumb;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x6265626d && *(int *)this == 0x6d756874;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = thumbeb;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x72 && *(short *)this == 0x7661;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = avr;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3033 && *(int *)this == 0x3470736d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = msp430;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000004) {
      bVar11 = *(int *)this == 0x7370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x6265 && *(int *)this == 0x7370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_0000000c) {
      bVar11 = *(int *)(this + 8) == 0x78657267 && *(long *)this == 0x656c6c617370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x6c65 && *(int *)this == 0x7370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mipsel;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_0000000e) {
      bVar11 = *(long *)(this + 6) == 0x6c6578657267656c && *(long *)this == 0x656c6c617370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mipsel;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3436 && *(int *)this == 0x7370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x8) {
      bVar11 = *(long *)this == 0x626534367370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x8) {
      bVar11 = *(long *)this == 0x6c6534367370696d;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = mips64el;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x32 && *(int *)this == 0x736f696e;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = nios2;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000004) {
      bVar11 = *(int *)this == 0x30303672;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = r600;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x6e63 && *(int *)this == 0x67646d61;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = amdgcn;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x32337663 && *(int *)this == 0x63736972;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = riscv32;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34367663 && *(int *)this == 0x63736972;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = riscv64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x6e6f6761 && *(int *)this == 0x61786568;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = hexagon;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x78 && *(int *)this == 0x30393373;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = systemz;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x7a6d6574 && *(int *)this == 0x74737973;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = systemz;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x63 && *(int *)this == 0x72617073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = sparc;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x6c656372 && *(int *)this == 0x72617073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = sparcel;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x39766372 && *(int *)this == 0x72617073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = sparcv9;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34366372 && *(int *)this == 0x72617073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = sparcv9;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x3) {
      bVar11 = this[2] == (ARM)0x65 && *(short *)this == 0x6374;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = tce;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x65 && *(int *)this == 0x6c656374;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = tcele;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x65 && *(int *)this == 0x726f6378;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = xcore;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x78 && *(int *)this == 0x7470766e;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = nvptx;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34367874 && *(int *)this == 0x7470766e;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = nvptx64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000004) {
      bVar11 = *(int *)this == 0x3233656c;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = le32;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000004) {
      bVar11 = *(int *)this == 0x3436656c;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = le64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x6c && *(int *)this == 0x69646d61;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = amdil;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34366c69 && *(int *)this == 0x69646d61;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = amdil64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x6c && *(int *)this == 0x69617368;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = hsail;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000007) {
      bVar11 = *(int *)(this + 3) == 0x34366c69 && *(int *)this == 0x69617368;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = hsail64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000004) {
      bVar11 = *(int *)this == 0x72697073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = spir;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3436 && *(int *)this == 0x72697073;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = spir64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data < (char *)0x7) {
      bVar11 = false;
    }
    else {
      bVar11 = *(int *)(this + 3) == 0x61626d69 && *(int *)this == 0x696c616b;
    }
    if (bVar11) {
      AVar2 = kalimba;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x69 && *(int *)this == 0x616e616c;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = lanai;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_00000005) {
      bVar11 = this[4] == (ARM)0x65 && *(int *)this == 0x76616873;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = shave;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3233 && *(int *)this == 0x6d736177;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = wasm32;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == (char *)0x6) {
      bVar11 = *(short *)(this + 4) == 0x3436 && *(int *)this == 0x6d736177;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = wasm64;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_0000000e) {
      bVar11 = *(long *)(this + 6) == 0x3233747069726373 && *(long *)this == 0x63737265646e6572;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = renderscript32;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    if (SVar12.Data == &DAT_0000000e) {
      bVar11 = *(long *)(this + 6) == 0x3436747069726373 && *(long *)this == 0x63737265646e6572;
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      AVar2 = LastArchType;
    }
    bVar1 = true;
    if (!bVar11) {
      bVar1 = false;
    }
  }
  AVar5 = UnknownArch;
  if (bVar1) {
    AVar5 = AVar2;
  }
  if (AVar5 != UnknownArch) {
    return AVar5;
  }
  if ((((SVar12.Data < (char *)0x3) ||
       (uVar8 = (byte)this[2] ^ 0x6d | *(ushort *)this ^ 0x7261, uVar10 = (ulong)uVar8, uVar8 != 0))
      && ((SVar12.Data < &DAT_00000005 ||
          (uVar9 = (byte)this[4] ^ 0x62 | *(uint *)this ^ 0x6d756874, uVar10 = (ulong)uVar9,
          uVar9 != 0)))) &&
     ((SVar12.Data < &DAT_00000007 ||
      (uVar9 = *(uint *)(this + 3) ^ 0x34366863 | *(uint *)this ^ 0x63726161, uVar10 = (ulong)uVar9,
      uVar9 != 0)))) {
    if (SVar12.Data < (char *)0x3) {
      return UnknownArch;
    }
    if (this[2] != (ARM)0x66 || *(short *)this != 0x7062) {
      return UnknownArch;
    }
    AVar2 = parseBPFArch(ArchName);
    return AVar2;
  }
  SVar12.Length = uVar10;
  IVar3 = llvm::ARM::parseArchISA(this,SVar12);
  Arch.Length = extraout_RDX;
  Arch.Data = SVar12.Data;
  EVar4 = llvm::ARM::parseArchEndian(this,Arch);
  if (EVar4 == BIG) {
    AVar2 = UnknownArch;
    if (2 < IVar3 - ARM) goto LAB_00169b18;
    puVar7 = &DAT_001a5028;
  }
  else {
    AVar2 = UnknownArch;
    if ((EVar4 != LITTLE) || (AVar2 = UnknownArch, 2 < IVar3 - ARM)) goto LAB_00169b18;
    puVar7 = &DAT_001a501c;
  }
  AVar2 = *(ArchType *)(puVar7 + (ulong)(IVar3 - ARM) * 4);
LAB_00169b18:
  Arch_00.Length = extraout_RDX_00;
  Arch_00.Data = SVar12.Data;
  SVar12 = llvm::ARM::getCanonicalArchName(this,Arch_00);
  AVar5 = UnknownArch;
  if ((SVar12.Length != 0) &&
     ((SVar12.Length == 1 || IVar3 != THUMB ||
      ((*(short *)SVar12.Data != 0x3276 && (*(short *)SVar12.Data != 0x3376)))))) {
    PVar6 = llvm::ARM::parseArchProfile(SVar12);
    uVar9 = llvm::ARM::parseArchVersion(SVar12);
    AVar5 = AVar2;
    if (uVar9 == 6 && PVar6 == M) {
      AVar5 = (EVar4 == BIG) + thumb;
    }
  }
  return AVar5;
}

Assistant:

static Triple::ArchType parseArch(StringRef ArchName) {
  auto AT = StringSwitch<Triple::ArchType>(ArchName)
    .Cases("i386", "i486", "i586", "i686", Triple::x86)
    // FIXME: Do we need to support these?
    .Cases("i786", "i886", "i986", Triple::x86)
    .Cases("amd64", "x86_64", "x86_64h", Triple::x86_64)
    .Cases("powerpc", "ppc", "ppc32", Triple::ppc)
    .Cases("powerpc64", "ppu", "ppc64", Triple::ppc64)
    .Cases("powerpc64le", "ppc64le", Triple::ppc64le)
    .Case("xscale", Triple::arm)
    .Case("xscaleeb", Triple::armeb)
    .Case("aarch64", Triple::aarch64)
    .Case("aarch64_be", Triple::aarch64_be)
    .Case("arc", Triple::arc)
    .Case("arm64", Triple::aarch64)
    .Case("arm", Triple::arm)
    .Case("armeb", Triple::armeb)
    .Case("thumb", Triple::thumb)
    .Case("thumbeb", Triple::thumbeb)
    .Case("avr", Triple::avr)
    .Case("msp430", Triple::msp430)
    .Cases("mips", "mipseb", "mipsallegrex", Triple::mips)
    .Cases("mipsel", "mipsallegrexel", Triple::mipsel)
    .Cases("mips64", "mips64eb", Triple::mips64)
    .Case("mips64el", Triple::mips64el)
    .Case("nios2", Triple::nios2)
    .Case("r600", Triple::r600)
    .Case("amdgcn", Triple::amdgcn)
    .Case("riscv32", Triple::riscv32)
    .Case("riscv64", Triple::riscv64)
    .Case("hexagon", Triple::hexagon)
    .Cases("s390x", "systemz", Triple::systemz)
    .Case("sparc", Triple::sparc)
    .Case("sparcel", Triple::sparcel)
    .Cases("sparcv9", "sparc64", Triple::sparcv9)
    .Case("tce", Triple::tce)
    .Case("tcele", Triple::tcele)
    .Case("xcore", Triple::xcore)
    .Case("nvptx", Triple::nvptx)
    .Case("nvptx64", Triple::nvptx64)
    .Case("le32", Triple::le32)
    .Case("le64", Triple::le64)
    .Case("amdil", Triple::amdil)
    .Case("amdil64", Triple::amdil64)
    .Case("hsail", Triple::hsail)
    .Case("hsail64", Triple::hsail64)
    .Case("spir", Triple::spir)
    .Case("spir64", Triple::spir64)
    .StartsWith("kalimba", Triple::kalimba)
    .Case("lanai", Triple::lanai)
    .Case("shave", Triple::shave)
    .Case("wasm32", Triple::wasm32)
    .Case("wasm64", Triple::wasm64)
    .Case("renderscript32", Triple::renderscript32)
    .Case("renderscript64", Triple::renderscript64)
    .Default(Triple::UnknownArch);

  // Some architectures require special parsing logic just to compute the
  // ArchType result.
  if (AT == Triple::UnknownArch) {
    if (ArchName.startswith("arm") || ArchName.startswith("thumb") ||
        ArchName.startswith("aarch64"))
      return parseARMArch(ArchName);
    if (ArchName.startswith("bpf"))
      return parseBPFArch(ArchName);
  }

  return AT;
}